

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::SectionNode::SectionNode(SectionNode *this,SectionStats *_stats)

{
  SectionStats *in_RDI;
  SectionStats *in_stack_ffffffffffffffe0;
  
  SharedImpl<Catch::IShared>::SharedImpl((SharedImpl<Catch::IShared> *)in_stack_ffffffffffffffe0);
  in_RDI->_vptr_SectionStats = (_func_int **)&PTR__SectionNode_002c1f50;
  SectionStats::SectionStats(in_stack_ffffffffffffffe0,in_RDI);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::vector((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            *)0x26beea);
  std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::vector
            ((vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *)0x26befa);
  std::__cxx11::string::string
            ((string *)(in_RDI[1].sectionInfo.description.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(in_RDI[1].sectionInfo.lineInfo.file.field_2._M_local_buf + 8));
  return;
}

Assistant:

explicit SectionNode( SectionStats const& _stats ) : stats( _stats ) {}